

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_file.c
# Opt level: O1

int64_t file_skip(archive_conflict *a,void *client_data,int64_t request)

{
  int error_number;
  __off_t _Var1;
  __off_t _Var2;
  int *piVar3;
  char *fmt;
  read_file_data *mine;
  
  if (*(char *)((long)client_data + 0x1c) == '\0') {
    return 0;
  }
  _Var1 = lseek(*client_data,0,1);
  if ((-1 < _Var1) && (_Var2 = lseek(*client_data,request,1), -1 < _Var2)) {
    return _Var2 - _Var1;
  }
  *(undefined1 *)((long)client_data + 0x1c) = 0;
  piVar3 = __errno_location();
  error_number = *piVar3;
  if (error_number == 0x1d) {
    return 0;
  }
  if (*(int *)((long)client_data + 0x20) == 1) {
    fmt = "Error seeking in \'%s\'";
  }
  else {
    if (*(int *)((long)client_data + 0x20) == 0) {
      archive_set_error((archive *)a,error_number,"Error seeking in stdin");
      return -1;
    }
    fmt = "Error seeking in \'%S\'";
  }
  archive_set_error((archive *)a,error_number,fmt,(long)client_data + 0x24);
  return -1;
}

Assistant:

static int64_t
file_skip(struct archive *a, void *client_data, int64_t request)
{
	struct read_FILE_data *mine = (struct read_FILE_data *)client_data;
#if HAVE_FSEEKO
	off_t skip = (off_t)request;
#elif HAVE__FSEEKI64
	int64_t skip = request;
#else
	long skip = (long)request;
#endif
	int skip_bits = sizeof(skip) * 8 - 1;

	(void)a; /* UNUSED */

	/*
	 * If we can't skip, return 0 as the amount we did step and
	 * the caller will work around by reading and discarding.
	 */
	if (!mine->can_skip)
		return (0);
	if (request == 0)
		return (0);

	/* If request is too big for a long or an off_t, reduce it. */
	if (sizeof(request) > sizeof(skip)) {
		int64_t max_skip =
		    (((int64_t)1 << (skip_bits - 1)) - 1) * 2 + 1;
		if (request > max_skip)
			skip = max_skip;
	}

#if HAVE_FSEEKO
	if (fseeko(mine->f, skip, SEEK_CUR) != 0)
#elif HAVE__FSEEKI64
	if (_fseeki64(mine->f, skip, SEEK_CUR) != 0)
#else
	if (fseek(mine->f, skip, SEEK_CUR) != 0)
#endif
	{
		mine->can_skip = 0;
		return (0);
	}
	return (request);
}